

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

_Bool al_use_shader(ALLEGRO_SHADER *shader)

{
  _Bool _Var1;
  uint uVar2;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *bmp_00;
  ulong uVar3;
  long in_RDI;
  ALLEGRO_DISPLAY *disp;
  ALLEGRO_BITMAP *bmp;
  int in_stack_00000024;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  ALLEGRO_SHADER *in_stack_ffffffffffffffd8;
  _Bool local_1;
  
  bitmap = al_get_target_bitmap();
  if (bitmap == (ALLEGRO_BITMAP *)0x0) {
    _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024
                             ,(char *)shader);
    if (_Var1) {
      _al_trace_suffix("No current target bitmap.\n");
    }
    local_1 = false;
  }
  else {
    uVar2 = al_get_bitmap_flags(bitmap);
    if ((uVar2 & 1) == 0) {
      bmp_00 = _al_get_bitmap_display(bitmap);
      if (in_RDI == 0) {
        if (bitmap->shader != (ALLEGRO_SHADER *)0x0) {
          (*bitmap->shader->vt->unuse_shader)(bitmap->shader,bmp_00);
          _al_set_bitmap_shader_field((ALLEGRO_BITMAP *)bmp_00,in_stack_ffffffffffffffd8);
        }
        if (bmp_00->default_shader != (ALLEGRO_SHADER *)0x0) {
          (*bmp_00->default_shader->vt->use_shader)(bmp_00->default_shader,bmp_00,true);
        }
        local_1 = true;
      }
      else {
        uVar3 = (**(code **)(*(long *)(in_RDI + 0x20) + 0x10))(in_RDI,bmp_00,1);
        if ((uVar3 & 1) == 0) {
          _al_set_bitmap_shader_field((ALLEGRO_BITMAP *)bmp_00,in_stack_ffffffffffffffd8);
          _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,
                                   in_stack_00000024,(char *)shader);
          if (_Var1) {
            _al_trace_suffix("use_shader failed\n");
          }
          if (bmp_00->default_shader != (ALLEGRO_SHADER *)0x0) {
            (*bmp_00->default_shader->vt->use_shader)(bmp_00->default_shader,bmp_00,true);
          }
          local_1 = false;
        }
        else {
          _al_set_bitmap_shader_field((ALLEGRO_BITMAP *)bmp_00,in_stack_ffffffffffffffd8);
          _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,
                                   in_stack_00000024,(char *)shader);
          if (_Var1) {
            _al_trace_suffix("use_shader succeeded\n");
          }
          local_1 = true;
        }
      }
    }
    else {
      _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,
                               in_stack_00000024,(char *)shader);
      if (_Var1) {
        _al_trace_suffix("Target bitmap is memory bitmap.\n");
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool al_use_shader(ALLEGRO_SHADER *shader)
{
   ALLEGRO_BITMAP *bmp = al_get_target_bitmap();
   ALLEGRO_DISPLAY *disp;

   if (!bmp) {
      ALLEGRO_WARN("No current target bitmap.\n");
      return false;
   }
   if (al_get_bitmap_flags(bmp) & ALLEGRO_MEMORY_BITMAP) {
      ALLEGRO_WARN("Target bitmap is memory bitmap.\n");
      return false;
   }
   disp = _al_get_bitmap_display(bmp);
   ASSERT(disp);

   if (shader) {
      if (shader->vt->use_shader(shader, disp, true)) {
         _al_set_bitmap_shader_field(bmp, shader);
         ALLEGRO_DEBUG("use_shader succeeded\n");
         return true;
      }
      else {
         _al_set_bitmap_shader_field(bmp, NULL);
         ALLEGRO_ERROR("use_shader failed\n");
         if (disp->default_shader) {
            disp->default_shader->vt->use_shader(
               disp->default_shader, disp, true);
         }
         return false;
      }
   }
   else {
      if (bmp->shader) {
         bmp->shader->vt->unuse_shader(bmp->shader, disp);
         _al_set_bitmap_shader_field(bmp, NULL);
      }
      if (disp->default_shader) {
         disp->default_shader->vt->use_shader(
            disp->default_shader, disp, true);
      }
      return true;
   }
}